

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

double __thiscall nnad::Matrix<double>::GetElement(Matrix<double> *this,int *i,int *j)

{
  const_reference pvVar1;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  allocator<char> local_71;
  string local_70 [16];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [32];
  int *local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((*in_RSI < 0) || (*in_RDI < *in_RSI)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    Error((string *)0x104a51);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  if ((*local_18 < 0) || (in_RDI[1] < *local_18)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    Error((string *)0x104af2);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),
                      (long)(*local_10 * in_RDI[1] + *local_18));
  return *pvVar1;
}

Assistant:

T GetElement(int const& i, int const& j) const
    {
      if (i < 0 || i > _Lines)
        Error("GetElement: line index out of range.");

      if (j < 0 || j > _Columns)
        Error("GetElement: column index out of range.");

      return _Matrix[i * _Columns + j];
    }